

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

QString * __thiscall
QTextDocument::toMarkdown
          (QString *__return_storage_ptr__,QTextDocument *this,MarkdownFeatures features)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  long in_FS_OFFSET;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  QArrayDataPointer<char16_t> local_a8;
  QTextMarkdownWriter w;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_b8 = 0xaaaaaaaa;
  uStack_b4 = 0xaaaaaaaa;
  uStack_b0 = 0xaaaaaaaa;
  uStack_ac = 0xaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_b8,&local_a8,3);
  w._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
  w.m_codeBlockFence.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  w._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  w.m_codeBlockFence.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  w.m_codeBlockFence.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  w.m_linePrefix.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  w.m_linePrefix.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  w.m_listInfo.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QTextList_*,_QTextMarkdownWriter::ListInfo,_std::less<QTextList_*>,_std::allocator<std::pair<QTextList_*const,_QTextMarkdownWriter::ListInfo>_>_>_>_>
        )&DAT_aaaaaaaaaaaaaaaa;
  w.m_linePrefix.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  w.m_stream = (QTextStream *)&DAT_aaaaaaaaaaaaaaaa;
  w._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextMarkdownWriter::QTextMarkdownWriter(&w,(QTextStream *)&local_b8,features);
  bVar5 = QTextMarkdownWriter::writeAll(&w,this);
  qVar4 = local_a8.size;
  pcVar3 = local_a8.ptr;
  pDVar2 = local_a8.d;
  if (bVar5) {
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pcVar3;
    local_a8.size = 0;
    (__return_storage_ptr__->d).size = qVar4;
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  QTextMarkdownWriter::~QTextMarkdownWriter(&w);
  QTextStream::~QTextStream((QTextStream *)&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextDocument::toMarkdown(QTextDocument::MarkdownFeatures features) const
{
    QString ret;
    QTextStream s(&ret);
    QTextMarkdownWriter w(s, features);
    if (w.writeAll(this))
        return ret;
    return QString();
}